

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Web_Constraint::Dependency_Removed(Web_Constraint *this,Am_Slot *removing_slot)

{
  Am_Web_Data *this_00;
  bool bVar1;
  Input_Port *local_30;
  Input_Port *curr;
  Input_Port *port;
  Input_Port *prev;
  Am_Slot *removing_slot_local;
  Web_Constraint *this_local;
  
  port = (Input_Port *)0x0;
  curr = this->owner->in_list;
  while( true ) {
    if (curr == (Input_Port *)0x0) {
      return;
    }
    bVar1 = Am_Slot::operator==(&curr->context,removing_slot);
    if (bVar1) break;
    port = curr;
    curr = curr->next;
  }
  if (port == (Input_Port *)0x0) {
    this->owner->in_list = curr->next;
  }
  else {
    port->next = curr->next;
  }
  curr->next = (Input_Port *)0x0;
  if (curr->prev_changed != (Input_Port *)0x0) {
    curr->prev_changed->next_changed = curr->next_changed;
  }
  if (this->owner->changed_first == curr) {
    this->owner->changed_first = curr->next_changed;
  }
  if (curr->next_changed != (Input_Port *)0x0) {
    curr->next_changed->prev_changed = curr->prev_changed;
  }
  if (this->owner->changed_last == curr) {
    this->owner->changed_last = curr->prev_changed;
  }
  curr->next_changed = (Input_Port *)0x0;
  curr->prev_changed = (Input_Port *)0x0;
  port = (Input_Port *)0x0;
  local_30 = this->owner->invalid_list;
  do {
    if (local_30 == (Input_Port *)0x0) {
LAB_00266c56:
      curr->next_invalid = (Input_Port *)0x0;
      if (curr != (Input_Port *)0x0) {
        Input_Port::~Input_Port(curr);
        Input_Port::operator_delete(curr,0x48);
      }
      if (this->owner->in_list != (Input_Port *)0x0) {
        return;
      }
      if (this->owner->out_list != (Output_Port *)0x0) {
        return;
      }
      this_00 = this->owner;
      if (this_00 == (Am_Web_Data *)0x0) {
        return;
      }
      Am_Web_Data::~Am_Web_Data(this_00);
      operator_delete(this_00);
      return;
    }
    if (local_30 == curr) {
      if (port == (Input_Port *)0x0) {
        this->owner->invalid_list = local_30->next_invalid;
      }
      else {
        port->next_invalid = local_30->next_invalid;
      }
      goto LAB_00266c56;
    }
    port = local_30;
    local_30 = local_30->next_invalid;
  } while( true );
}

Assistant:

void
Web_Constraint::Dependency_Removed(const Am_Slot &removing_slot)
{
  Input_Port *prev = nullptr;
  Input_Port *port = owner->in_list;
  while (port) {
    if (port->context == removing_slot) {
      if (prev)
        prev->next = port->next;
      else
        owner->in_list = port->next;
      port->next = nullptr;
      if (port->prev_changed)
        port->prev_changed->next_changed = port->next_changed;
      if (owner->changed_first == port)
        owner->changed_first = port->next_changed;
      if (port->next_changed)
        port->next_changed->prev_changed = port->prev_changed;
      if (owner->changed_last == port)
        owner->changed_last = port->prev_changed;
      port->next_changed = nullptr;
      port->prev_changed = nullptr;
      prev = nullptr;
      Input_Port *curr = owner->invalid_list;
      while (curr) {
        if (curr == port) {
          if (prev)
            prev->next_invalid = curr->next_invalid;
          else
            owner->invalid_list = curr->next_invalid;
          break;
        }
        prev = curr;
        curr = curr->next_invalid;
      }
      port->next_invalid = nullptr;
      delete port;
      if (!owner->in_list && !owner->out_list)
        delete owner;
      break;
    }
    prev = port;
    port = port->next;
  }
}